

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

void __thiscall ArgsManager::ArgsManager(ArgsManager *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((long)&(this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->cs_args).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  p_Var1 = &(this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_command).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_command).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_command).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_network)._M_dataplus._M_p = (pointer)&(this->m_network).field_2;
  (this->m_network)._M_string_length = 0;
  (this->m_network).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header;
  (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_available_args)._M_t._M_impl.super__Rb_tree_header;
  (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_accept_any_command = true;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_config_sections;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_config_sections;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  (this->m_config_path).super__Optional_base<fs::path,_false,_false>._M_payload.
  super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
  _M_engaged = false;
  std::filesystem::__cxx11::path::path(&(this->m_cached_blocks_path).super_path);
  std::filesystem::__cxx11::path::path(&(this->m_cached_datadir_path).super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::filesystem::__cxx11::path::path(&(this->m_cached_network_datadir_path).super_path);
    return;
  }
  __stack_chk_fail();
}

Assistant:

ArgsManager::ArgsManager() = default;